

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

IceTCommRequest Irecv(IceTCommunicator self,void *buf,int count,IceTEnum datatype,int src,int tag)

{
  undefined *local_40;
  MPI_Datatype mpidatatype;
  MPI_Request mpi_request;
  IceTCommRequest icet_request;
  int tag_local;
  int src_local;
  IceTEnum datatype_local;
  int count_local;
  void *buf_local;
  IceTCommunicator self_local;
  
  icet_request._0_4_ = tag;
  icet_request._4_4_ = src;
  tag_local = datatype;
  src_local = count;
  _datatype_local = buf;
  buf_local = self;
  switch(datatype) {
  case 0x8000:
    local_40 = &ompi_mpi_byte;
    break;
  case 0x8001:
    local_40 = &ompi_mpi_byte;
    break;
  case 0x8002:
    local_40 = &ompi_mpi_short;
    break;
  case 0x8003:
    local_40 = &ompi_mpi_int;
    break;
  case 0x8004:
    local_40 = &ompi_mpi_float;
    break;
  case 0x8005:
    local_40 = &ompi_mpi_double;
    break;
  default:
    icetRaiseDiagnostic("MPI Communicator received bad data type.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,400);
    local_40 = &ompi_mpi_byte;
  }
  MPI_Irecv(_datatype_local,src_local,local_40,icet_request._4_4_,(int)icet_request,
            **(undefined8 **)((long)buf_local + 0x78),&mpidatatype);
  mpi_request = (MPI_Request)create_request();
  setMPIRequest((IceTCommRequest)mpi_request,(MPI_Request)mpidatatype);
  return (IceTCommRequest)mpi_request;
}

Assistant:

static IceTCommRequest Irecv(IceTCommunicator self,
                             void *buf,
                             int count,
                             IceTEnum datatype,
                             int src,
                             int tag)
{
    IceTCommRequest icet_request;
    MPI_Request mpi_request;
    MPI_Datatype mpidatatype;

    CONVERT_DATATYPE(datatype, mpidatatype);
    MPI_Irecv(buf, count, mpidatatype, src, tag, MPI_COMM,
              &mpi_request);

    icet_request = create_request();
    setMPIRequest(icet_request, mpi_request);

    return icet_request;
}